

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  PyTypeObject *pPVar1;
  handle hVar2;
  object oVar3;
  int iVar4;
  object *poVar5;
  long *plVar6;
  internals *piVar7;
  _Fwd_list_node_base *p_Var8;
  size_t sVar9;
  void *__dest;
  long lVar10;
  PyObject **ppPVar11;
  PyObject *pPVar12;
  error_already_set *this;
  PyObject *pPVar13;
  size_type *psVar14;
  object *object;
  PyTypeObject *pPVar15;
  PyTypeObject *type;
  string local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  void *local_c8;
  string local_c0;
  handle local_a0;
  long local_98;
  PyObject local_90;
  object local_80;
  handle local_78;
  object qualname;
  handle local_68;
  _Fwd_list_node_base *local_60;
  _Fwd_list_impl _Stack_58;
  handle local_50;
  object name;
  handle local_40;
  object module;
  tuple bases;
  
  local_78.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  if (local_78.m_ptr != (PyObject *)0x0) {
    (local_78.m_ptr)->ob_refcnt = (local_78.m_ptr)->ob_refcnt + 1;
  }
  pPVar13 = (rec->scope).m_ptr;
  local_50.m_ptr = local_78.m_ptr;
  if ((pPVar13 != (PyObject *)0x0) &&
     (pPVar1 = pPVar13->ob_type, pPVar1 != (PyTypeObject *)&PyModule_Type)) {
    iVar4 = PyType_IsSubtype(pPVar1,&PyModule_Type);
    if (iVar4 == 0) {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__qualname__");
      if (iVar4 == 1) {
        local_68.m_ptr = (rec->scope).m_ptr;
        local_60 = (_Fwd_list_node_base *)0x11891a;
        _Stack_58._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
        poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)&qualname);
        local_a0.m_ptr =
             (PyObject *)PyUnicode_FromFormat("%U.%U",(poVar5->super_handle).m_ptr,local_50.m_ptr);
        pybind11::object::operator=((object *)&local_78,(object *)&local_a0);
        pybind11::object::~object((object *)&local_a0);
        pybind11::object::~object((object *)&_Stack_58);
      }
    }
  }
  local_40.m_ptr = (PyObject *)0x0;
  pPVar13 = (rec->scope).m_ptr;
  if (pPVar13 != (PyObject *)0x0) {
    iVar4 = PyObject_HasAttrString(pPVar13,"__module__");
    if (iVar4 == 1) {
      local_68.m_ptr = (rec->scope).m_ptr;
      local_60 = (_Fwd_list_node_base *)0x1185ed;
      _Stack_58._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)&qualname);
    }
    else {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar4 != 1) goto LAB_00112aae;
      local_68.m_ptr = (rec->scope).m_ptr;
      local_60 = (_Fwd_list_node_base *)0x1182a6;
      _Stack_58._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)&qualname);
    }
    local_a0.m_ptr = (poVar5->super_handle).m_ptr;
    if (local_a0.m_ptr != (PyObject *)0x0) {
      (local_a0.m_ptr)->ob_refcnt = (local_a0.m_ptr)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&local_40,(object *)&local_a0);
    pybind11::object::~object((object *)&local_a0);
    pybind11::object::~object((object *)&_Stack_58);
  }
LAB_00112aae:
  hVar2.m_ptr = local_40.m_ptr;
  if (local_40.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&qualname,rec->name,(allocator *)&local_a0);
  }
  else {
    str::str((str *)&local_80,(object *)&local_40);
    cast<std::__cxx11::string>(&local_128,(pybind11 *)&local_80,object);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
    local_a0.m_ptr = &local_90;
    pPVar13 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)*plVar6 == pPVar13) {
      local_90.ob_refcnt = pPVar13->ob_refcnt;
      local_90.ob_type = (PyTypeObject *)plVar6[3];
    }
    else {
      local_90.ob_refcnt = pPVar13->ob_refcnt;
      local_a0.m_ptr = (PyObject *)*plVar6;
    }
    local_98 = plVar6[1];
    *plVar6 = (long)pPVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
    qualname.super_handle.m_ptr = (handle)&local_60;
    pPVar13 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)*plVar6 == pPVar13) {
      local_60 = (_Fwd_list_node_base *)pPVar13->ob_refcnt;
      _Stack_58._M_head._M_next = (_Fwd_list_node_base)plVar6[3];
    }
    else {
      local_60 = (_Fwd_list_node_base *)pPVar13->ob_refcnt;
      qualname.super_handle.m_ptr = (handle)(handle)*plVar6;
    }
    local_68.m_ptr = (PyObject *)plVar6[1];
    *plVar6 = (long)pPVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  piVar7 = get_internals();
  p_Var8 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var8->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var8[1]._M_next = p_Var8 + 3;
  if (qualname.super_handle.m_ptr == (handle)&local_60) {
    p_Var8[3]._M_next = local_60;
    p_Var8[4]._M_next = (_Fwd_list_node_base *)_Stack_58._M_head._M_next;
  }
  else {
    p_Var8[1]._M_next = (_Fwd_list_node_base *)qualname.super_handle.m_ptr;
    p_Var8[3]._M_next = local_60;
  }
  p_Var8[2]._M_next = (_Fwd_list_node_base *)local_68.m_ptr;
  local_60 = (_Fwd_list_node_base *)((ulong)local_60 & 0xffffffffffffff00);
  p_Var8->_M_next =
       (piVar7->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar7->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var8;
  pPVar1 = (PyTypeObject *)p_Var8[1]._M_next;
  qualname.super_handle.m_ptr = (handle)(PyObject *)&local_60;
  if (hVar2.m_ptr != (PyObject *)0x0) {
    if (local_a0.m_ptr != &local_90) {
      operator_delete(local_a0.m_ptr,local_90.ob_refcnt + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object(&local_80);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar9 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar9 + 1);
    memcpy(__dest,rec->doc,sVar9 + 1);
  }
  piVar7 = get_internals();
  tuple::tuple((tuple *)&module,&(rec->bases).super_object);
  lVar10 = PyTuple_Size(module.super_handle.m_ptr);
  local_c8 = __dest;
  if (lVar10 == 0) {
    ppPVar11 = &piVar7->instance_base;
  }
  else {
    local_60 = (_Fwd_list_node_base *)0x0;
    _Stack_58._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
    ppPVar11 = (PyObject **)
               accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&qualname);
  }
  pPVar13 = *ppPVar11;
  if (lVar10 != 0) {
    pybind11::object::~object((object *)&_Stack_58);
  }
  pPVar15 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar15 == (PyTypeObject *)0x0) {
    pPVar15 = piVar7->default_metaclass;
  }
  pPVar12 = (*pPVar15->tp_alloc)(pPVar15,0);
  hVar2.m_ptr = local_50.m_ptr;
  if (pPVar12 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_108,rec->name,(allocator *)&local_e8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar14) {
      local_c0.field_2._M_allocated_capacity = *psVar14;
      local_c0.field_2._8_8_ = plVar6[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar14;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail(&local_c0);
  }
  local_50.m_ptr = (PyObject *)0x0;
  pPVar12[0x35].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  if (local_78.m_ptr != (PyObject *)0x0) {
    (local_78.m_ptr)->ob_refcnt = (local_78.m_ptr)->ob_refcnt + 1;
  }
  pPVar12[0x36].ob_refcnt = (Py_ssize_t)local_78.m_ptr;
  pPVar12[1].ob_type = pPVar1;
  pPVar12[0xb].ob_refcnt = (Py_ssize_t)local_c8;
  pPVar13->ob_refcnt = pPVar13->ob_refcnt + 1;
  pPVar12[0x10].ob_refcnt = (Py_ssize_t)pPVar13;
  pPVar12[2].ob_refcnt = 0x38;
  lVar10 = PyTuple_Size(module.super_handle.m_ptr);
  oVar3 = module;
  if (lVar10 != 0) {
    module.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pPVar12[0x15].ob_refcnt = (Py_ssize_t)oVar3.super_handle.m_ptr;
  }
  pPVar12[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar12[6].ob_refcnt = (Py_ssize_t)&pPVar12[0x1b].ob_type;
  pPVar12[6].ob_type = (PyTypeObject *)(pPVar12 + 0x2f);
  pPVar12[7].ob_refcnt = (Py_ssize_t)&pPVar12[0x2d].ob_type;
  pPVar12[5].ob_refcnt = (Py_ssize_t)&pPVar12[0x19].ob_type;
  pPVar1 = pPVar12[10].ob_type;
  pPVar12[10].ob_type = (PyTypeObject *)((ulong)pPVar1 | 0x600);
  if ((rec->field_0x60 & 2) != 0) {
    pPVar12[10].ob_type = (PyTypeObject *)((ulong)pPVar1 | 0x4600);
    pPVar12[0x12].ob_refcnt = pPVar12[2].ob_refcnt;
    pPVar12[2].ob_refcnt = pPVar12[2].ob_refcnt + 8;
    pPVar12[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar12[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar12[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
  }
  if ((rec->field_0x60 & 4) != 0) {
    pPVar12[10].ob_refcnt = (Py_ssize_t)(pPVar12 + 0x34);
    pPVar12[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar12[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar4 = PyType_Ready(pPVar12);
  if (iVar4 < 0) {
    std::__cxx11::string::string
              (local_168,rec->name,(allocator *)((long)&name.super_handle.m_ptr + 7));
    plVar6 = (long *)std::__cxx11::string::append((char *)local_168);
    local_e8._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar14) {
      local_e8.field_2._M_allocated_capacity = *psVar14;
      local_e8.field_2._8_8_ = plVar6[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar14;
    }
    local_e8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_108,&local_e8,&local_148);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_c0._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar14) {
      local_c0.field_2._M_allocated_capacity = *psVar14;
      local_c0.field_2._8_8_ = plVar6[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar14;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail(&local_c0);
  }
  if (((rec->field_0x60 & 2) == 0) != (((ulong)pPVar12[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CRPropa[P]sophia_next/lib/pybind11/include/pybind11/detail/class.h"
                  ,0x26e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar13 = (rec->scope).m_ptr;
  if (pPVar13 == (PyObject *)0x0) {
    pPVar12->ob_refcnt = pPVar12->ob_refcnt + 1;
  }
  else {
    iVar4 = PyObject_SetAttrString(pPVar13,rec->name,pPVar12);
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_00112ff0;
    }
  }
  if (local_40.m_ptr != (PyObject *)0x0) {
    iVar4 = PyObject_SetAttrString(pPVar12,"__module__");
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
LAB_00112ff0:
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  pybind11::object::~object(&module);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object((object *)&local_78);
  pybind11::object::~object((object *)&local_50);
  return pPVar12;
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module ? str(module).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
#if PY_VERSION_HEX >= 0x03050000
    type->tp_as_async = &heap_type->as_async;
#endif

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}